

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ba_sparse_matrix.h
# Opt level: O2

SparseMatrix<double> * __thiscall
sfm::ba::SparseMatrix<double>::subtract
          (SparseMatrix<double> *__return_storage_ptr__,SparseMatrix<double> *this,
          SparseMatrix<double> *rhs)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  ulong uVar4;
  double dVar5;
  SparseMatrix<double> *pSVar6;
  double dVar7;
  unsigned_long uVar8;
  ulong uVar9;
  invalid_argument *this_00;
  long lVar10;
  ulong uVar11;
  double *__x;
  long lVar12;
  double local_78;
  size_t id2;
  SparseMatrix<double> *local_68;
  double local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  unsigned_long local_50;
  SparseMatrix<double> *local_48;
  double local_40;
  size_t id1;
  
  if ((this->rows != rhs->rows) || (this->cols != rhs->cols)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Incompatible matrix dimensions");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  SparseMatrix(__return_storage_ptr__,this->rows,this->cols);
  local_68 = __return_storage_ptr__;
  reserve(__return_storage_ptr__,
          ((long)(rhs->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(rhs->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) +
          ((long)(this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3));
  puVar1 = (this->outer).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (this->outer).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  id1 = (size_t)&__return_storage_ptr__->values;
  local_58 = &__return_storage_ptr__->inner;
  lVar10 = 0;
  local_48 = this;
LAB_0011659d:
  uVar8 = (long)(__return_storage_ptr__->values).super__Vector_base<double,_std::allocator<double>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(__return_storage_ptr__->values).super__Vector_base<double,_std::allocator<double>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  if (lVar10 == ((long)puVar1 - (long)puVar2 >> 3) + -1) {
    (__return_storage_ptr__->outer).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish[-1] = uVar8;
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->outer).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start[lVar10] = uVar8;
  puVar3 = (local_48->outer).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar11 = puVar3[lVar10];
  uVar4 = puVar3[lVar10 + 1];
  puVar3 = (rhs->outer).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = puVar3[lVar10];
  id2 = puVar3[lVar10 + 1];
  lVar10 = lVar10 + 1;
  do {
    lVar12 = uVar8 * 8;
    local_50 = uVar8;
    while( true ) {
      pSVar6 = local_48;
      if ((uVar4 <= uVar11) && (__return_storage_ptr__ = local_68, id2 <= uVar8)) goto LAB_0011659d;
      if (uVar11 < uVar4) break;
      local_40 = -*(double *)
                   ((long)(rhs->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar12);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                ((vector<double,_std::allocator<double>_> *)id1,&local_40);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (local_58,(value_type_conflict4 *)
                          ((long)(rhs->inner).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar12));
      uVar8 = uVar8 + 1;
      lVar12 = lVar12 + 8;
    }
    if (uVar8 < id2) {
      local_40 = (double)(local_48->inner).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar11];
      local_78 = (double)(rhs->inner).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[local_50];
      if ((ulong)local_40 < (ulong)local_78) {
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)id1,
                   (local_48->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar11);
      }
      else if ((ulong)local_78 < (ulong)local_40) {
        local_60 = -(rhs->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[local_50];
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)id1,&local_60);
      }
      else {
        local_60 = (local_48->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar11] -
                   (rhs->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[local_50];
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)id1,&local_60);
      }
      dVar7 = local_40;
      dVar5 = local_78;
      __x = &local_40;
      if ((ulong)local_78 < (ulong)local_40) {
        __x = &local_78;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (local_58,(value_type_conflict4 *)__x);
      uVar8 = (local_50 + 1) - (ulong)((ulong)dVar7 < (ulong)dVar5);
      uVar9 = (ulong)((ulong)dVar7 <= (ulong)dVar5);
    }
    else {
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)id1,
                 (local_48->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar11);
      uVar8 = local_50;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (local_58,(pSVar6->inner).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar11);
      uVar9 = 1;
    }
    uVar11 = uVar11 + uVar9;
  } while( true );
}

Assistant:

SparseMatrix<T>
SparseMatrix<T>::subtract (SparseMatrix const& rhs) const
{
    if (this->rows != rhs.rows || this->cols != rhs.cols)
        throw std::invalid_argument("Incompatible matrix dimensions");

    SparseMatrix ret(this->rows, this->cols);
    ret.reserve(this->num_non_zero() + rhs.num_non_zero());

    std::size_t num_outer = this->outer.size() - 1;
    for (std::size_t outer = 0; outer < num_outer; ++outer)
    {
        ret.outer[outer] = ret.values.size();

        std::size_t i1 = this->outer[outer];
        std::size_t i2 = rhs.outer[outer];
        std::size_t const i1_end = this->outer[outer + 1];
        std::size_t const i2_end = rhs.outer[outer + 1];
        while (i1 < i1_end || i2 < i2_end)
        {
            if (i1 >= i1_end)
            {
                ret.values.push_back(-rhs.values[i2]);
                ret.inner.push_back(rhs.inner[i2]);
                i2 += 1;
                continue;
            }
            if (i2 >= i2_end)
            {
                ret.values.push_back(this->values[i1]);
                ret.inner.push_back(this->inner[i1]);
                i1 += 1;
                continue;
            }

            std::size_t id1 = this->inner[i1];
            std::size_t id2 = rhs.inner[i2];

            if (id1 < id2)
                ret.values.push_back(this->values[i1]);
            else if (id2 < id1)
                ret.values.push_back(-rhs.values[i2]);
            else
                ret.values.push_back(this->values[i1] - rhs.values[i2]);

            i1 += static_cast<std::size_t>(id1 <= id2);
            i2 += static_cast<std::size_t>(id2 <= id1);
            ret.inner.push_back(std::min(id1, id2));
        }
    }
    ret.outer.back() = ret.values.size();

    return ret;
}